

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O0

int nn_bipc_create(void *hint,nn_epbase **epbase)

{
  nn_fsm *self_00;
  nn_ctx *ctx;
  size_t local_30;
  size_t sz;
  int reconnect_ivl_max;
  int reconnect_ivl;
  nn_bipc *self;
  nn_epbase **epbase_local;
  void *hint_local;
  
  self = (nn_bipc *)epbase;
  epbase_local = (nn_epbase **)hint;
  _reconnect_ivl_max = (nn_fsm *)nn_alloc_(0x3f0);
  if (_reconnect_ivl_max == (nn_fsm *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x6e);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_epbase_init((nn_epbase *)&_reconnect_ivl_max[1].shutdown_fn,&nn_bipc_epbase_vfptr,epbase_local)
  ;
  self_00 = _reconnect_ivl_max;
  ctx = nn_epbase_getctx((nn_epbase *)&_reconnect_ivl_max[1].shutdown_fn);
  nn_fsm_init_root(self_00,nn_bipc_handler,nn_bipc_shutdown,ctx);
  *(undefined4 *)&_reconnect_ivl_max[1].fn = 1;
  local_30 = 4;
  nn_epbase_getopt((nn_epbase *)&_reconnect_ivl_max[1].shutdown_fn,0,6,(void *)((long)&sz + 4),
                   &local_30);
  if (local_30 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x78);
    fflush(_stderr);
    nn_err_abort();
  }
  local_30 = 4;
  nn_epbase_getopt((nn_epbase *)&_reconnect_ivl_max[1].shutdown_fn,0,7,&sz,&local_30);
  if (local_30 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl_max)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x7c);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((int)sz == 0) {
    sz._0_4_ = sz._4_4_;
  }
  nn_backoff_init((nn_backoff *)&_reconnect_ivl_max[8].stopped.src,3,sz._4_4_,(int)sz,
                  _reconnect_ivl_max);
  nn_usock_init((nn_usock *)&_reconnect_ivl_max[1].srcptr,1,_reconnect_ivl_max);
  _reconnect_ivl_max[8].owner = (nn_fsm *)0x0;
  nn_list_init((nn_list *)&_reconnect_ivl_max[8].ctx);
  nn_fsm_start(_reconnect_ivl_max);
  (self->fsm).fn = (nn_fsm_fn)&_reconnect_ivl_max[1].shutdown_fn;
  return 0;
}

Assistant:

int nn_bipc_create (void *hint, struct nn_epbase **epbase)
{
    struct nn_bipc *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_bipc), "bipc");
    alloc_assert (self);

    /*  Initialise the structure. */
    nn_epbase_init (&self->epbase, &nn_bipc_epbase_vfptr, hint);
    nn_fsm_init_root (&self->fsm, nn_bipc_handler, nn_bipc_shutdown,
        nn_epbase_getctx (&self->epbase));
    self->state = NN_BIPC_STATE_IDLE;
    sz = sizeof (reconnect_ivl);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL,
        &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_BIPC_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_usock_init (&self->usock, NN_BIPC_SRC_USOCK, &self->fsm);
    self->aipc = NULL;
    nn_list_init (&self->aipcs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Return the base class as an out parameter. */
    *epbase = &self->epbase;

    return 0;
}